

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::BeginGroup(void)

{
  int *piVar1;
  float fVar2;
  int iVar3;
  int iVar4;
  ImGuiWindow *pIVar5;
  ImGuiGroupData *pIVar6;
  ImGuiContext *pIVar7;
  ImGuiGroupData *__dest;
  int iVar8;
  int iVar9;
  ImGuiContext *g;
  float fVar10;
  
  pIVar7 = GImGui;
  pIVar5 = GImGui->CurrentWindow;
  pIVar5->WriteAccessed = true;
  iVar3 = (pIVar5->DC).GroupStack.Size;
  iVar9 = iVar3 + 1;
  iVar4 = (pIVar5->DC).GroupStack.Capacity;
  if (iVar4 <= iVar3) {
    if (iVar4 == 0) {
      iVar8 = 8;
    }
    else {
      iVar8 = iVar4 / 2 + iVar4;
    }
    if (iVar8 <= iVar9) {
      iVar8 = iVar9;
    }
    if (iVar4 < iVar8) {
      if (pIVar7 != (ImGuiContext *)0x0) {
        piVar1 = &(pIVar7->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      __dest = (ImGuiGroupData *)(*GImAllocatorAllocFunc)((long)iVar8 * 0x30,GImAllocatorUserData);
      pIVar6 = (pIVar5->DC).GroupStack.Data;
      if (pIVar6 != (ImGuiGroupData *)0x0) {
        memcpy(__dest,pIVar6,(long)(pIVar5->DC).GroupStack.Size * 0x30);
        pIVar6 = (pIVar5->DC).GroupStack.Data;
        if ((pIVar6 != (ImGuiGroupData *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(pIVar6,GImAllocatorUserData);
      }
      (pIVar5->DC).GroupStack.Data = __dest;
      (pIVar5->DC).GroupStack.Capacity = iVar8;
    }
  }
  (pIVar5->DC).GroupStack.Size = iVar9;
  pIVar6 = (pIVar5->DC).GroupStack.Data;
  pIVar6[iVar3].BackupCursorPos = (pIVar5->DC).CursorPos;
  pIVar6[iVar3].BackupCursorMaxPos = (pIVar5->DC).CursorMaxPos;
  pIVar6[iVar3].BackupIndent.x = (pIVar5->DC).Indent.x;
  pIVar6[iVar3].BackupGroupOffset.x = (pIVar5->DC).GroupOffset.x;
  pIVar6[iVar3].BackupCurrentLineSize = (pIVar5->DC).CurrentLineSize;
  pIVar6[iVar3].BackupCurrentLineTextBaseOffset = (pIVar5->DC).CurrentLineTextBaseOffset;
  pIVar6[iVar3].BackupLogLinePosY = (pIVar5->DC).LogLinePosY;
  pIVar6[iVar3].BackupActiveIdIsAlive = pIVar7->ActiveIdIsAlive;
  pIVar6[iVar3].BackupActiveIdPreviousFrameIsAlive = pIVar7->ActiveIdPreviousFrameIsAlive;
  pIVar6[iVar3].AdvanceCursor = true;
  fVar2 = (pIVar5->DC).CursorPos.y;
  fVar10 = ((pIVar5->DC).CursorPos.x - (pIVar5->Pos).x) - (pIVar5->DC).ColumnsOffset.x;
  (pIVar5->DC).GroupOffset.x = fVar10;
  (pIVar5->DC).Indent.x = fVar10;
  (pIVar5->DC).CursorMaxPos = (pIVar5->DC).CursorPos;
  (pIVar5->DC).CurrentLineSize.x = 0.0;
  (pIVar5->DC).CurrentLineSize.y = 0.0;
  (pIVar5->DC).LogLinePosY = fVar2 + -9999.0;
  return;
}

Assistant:

void ImGui::BeginGroup()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();

    window->DC.GroupStack.resize(window->DC.GroupStack.Size + 1);
    ImGuiGroupData& group_data = window->DC.GroupStack.back();
    group_data.BackupCursorPos = window->DC.CursorPos;
    group_data.BackupCursorMaxPos = window->DC.CursorMaxPos;
    group_data.BackupIndent = window->DC.Indent;
    group_data.BackupGroupOffset = window->DC.GroupOffset;
    group_data.BackupCurrentLineSize = window->DC.CurrentLineSize;
    group_data.BackupCurrentLineTextBaseOffset = window->DC.CurrentLineTextBaseOffset;
    group_data.BackupLogLinePosY = window->DC.LogLinePosY;
    group_data.BackupActiveIdIsAlive = g.ActiveIdIsAlive;
    group_data.BackupActiveIdPreviousFrameIsAlive = g.ActiveIdPreviousFrameIsAlive;
    group_data.AdvanceCursor = true;

    window->DC.GroupOffset.x = window->DC.CursorPos.x - window->Pos.x - window->DC.ColumnsOffset.x;
    window->DC.Indent = window->DC.GroupOffset;
    window->DC.CursorMaxPos = window->DC.CursorPos;
    window->DC.CurrentLineSize = ImVec2(0.0f, 0.0f);
    window->DC.LogLinePosY = window->DC.CursorPos.y - 9999.0f; // To enforce Log carriage return
}